

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderMatrixCase::init(ShaderMatrixCase *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  pointer pMVar2;
  OperationType OVar3;
  TestMatrixType TVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  ostringstream *poVar9;
  DataType DVar10;
  EVP_PKEY_CTX *pEVar11;
  int attribNdx;
  int precision;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  long lVar13;
  string *psVar14;
  char *__s;
  ShaderMatrixCase *pSVar15;
  EVP_PKEY_CTX *ctx_00;
  long lVar16;
  uint uVar17;
  pointer pbVar18;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  bool bVar19;
  bool bVar20;
  float fVar21;
  int local_474;
  ShaderMatrixCase *local_470;
  ostringstream *local_468;
  allocator<char> local_459;
  Precision local_458;
  DataType local_454;
  ulong local_450;
  int local_444;
  Matrix<float,_4,_4> local_440;
  char *local_400;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  string operationValue0;
  string inValue0;
  string local_380;
  string operationValue1;
  string inValue1;
  ostringstream vtx;
  ostringstream frag;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  local_468 = (ostringstream *)&frag;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    local_468 = (ostringstream *)&vtx;
  }
  DVar10 = (this->m_in0).dataType;
  local_450 = (ulong)DVar10;
  DVar1 = (this->m_in1).dataType;
  inValue0._M_dataplus._M_p = (pointer)&inValue0.field_2;
  inValue0._M_string_length = 0;
  inValue0.field_2._M_local_buf[0] = '\0';
  inValue1._M_dataplus._M_p = (pointer)&inValue1.field_2;
  inValue1._M_string_length = 0;
  inValue1.field_2._M_local_buf[0] = '\0';
  local_458 = (this->m_in0).precision;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_470 = this;
  OVar3 = MatrixCaseUtils::getOperationType(this->m_op);
  if (OVar3 < OPERATIONTYPE_LAST) {
    local_444 = *(int *)(&DAT_01813cd4 + (ulong)OVar3 * 4);
  }
  else {
    local_444 = 1;
  }
  bVar19 = DVar10 - TYPE_DOUBLE_MAT2 < 9;
  bVar20 = DVar10 - TYPE_FLOAT_MAT2 < 9;
  operationValue0._M_dataplus._M_p = (pointer)&operationValue0.field_2;
  operationValue0._M_string_length = 0;
  operationValue1._M_dataplus._M_p = (pointer)&operationValue1.field_2;
  operationValue1._M_string_length = 0;
  operationValue0.field_2._M_local_buf[0] = '\0';
  operationValue1.field_2._M_local_buf[0] = '\0';
  local_454 = (DataType)local_450;
  if (((!bVar20 && !bVar19) || (8 < DVar1 - TYPE_FLOAT_MAT2 && 8 < DVar1 - TYPE_DOUBLE_MAT2)) &&
     ((OVar3 & ~OPERATIONTYPE_BINARY_FUNCTION) != OPERATIONTYPE_UNARY_PREFIX_OPERATOR)) {
    DVar10 = local_454;
    if (bVar20 || bVar19) {
      DVar10 = DVar1;
      DVar1 = local_454;
    }
    local_454 = DVar10;
    if (DVar10 == TYPE_FLOAT) {
      local_454 = DVar1;
    }
    local_450 = (ulong)local_454;
  }
  std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                  "attribute highp vec4 a_position;\n");
  if ((local_470->super_ShaderRenderCase).m_isVertexCase == true) {
    std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                    "varying mediump vec4 v_color;\n");
    std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                    "varying mediump vec4 v_color;\n");
  }
  local_400 = ";\n";
  for (local_474 = 0; pSVar15 = local_470, local_474 < local_444; local_474 = local_474 + 1) {
    lVar12 = 0x128;
    if (0 < local_474) {
      lVar12 = 0x134;
    }
    pcVar6 = glu::getPrecisionName
                       (*(Precision *)
                         ((long)&(local_470->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                 m_testCtx + lVar12));
    pcVar7 = glu::getDataTypeName
                       (*(DataType *)
                         ((long)&(pSVar15->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                 _vptr_TestNode + lVar12 + 4));
    psVar14 = &inValue0;
    if (0 < local_474) {
      psVar14 = &inValue1;
    }
    iVar5 = *(int *)((long)&(pSVar15->super_ShaderRenderCase).super_TestCase.super_TestNode.
                            _vptr_TestNode + lVar12);
    if (iVar5 == 0) {
      poVar8 = std::operator<<((ostream *)local_468,"const ");
      poVar8 = std::operator<<(poVar8,pcVar6);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,pcVar7);
      poVar8 = std::operator<<(poVar8," in");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_474);
      std::operator<<(poVar8," = ");
      switch(*(undefined4 *)
              ((long)&(local_470->super_ShaderRenderCase).super_TestCase.super_TestNode.
                      _vptr_TestNode + lVar12 + 4)) {
      case 1:
        de::floatToString_abi_cxx11_
                  ((string *)&local_440,(de *)&DAT_00000001,
                   *(float *)((long)&deqp::gles3::Functional::s_constInFloat + (long)local_474 * 4),
                   precision);
        std::operator<<((ostream *)local_468,(string *)&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        break;
      case 2:
        MatrixCaseUtils::writeVectorConstructor<2>
                  ((ostream *)local_468,(Vector<float,_2> *)(s_constInVec2 + (long)local_474 * 8));
        break;
      case 3:
        MatrixCaseUtils::writeVectorConstructor<3>
                  ((ostream *)local_468,(Vector<float,_3> *)(s_constInVec3 + (long)local_474 * 0xc))
        ;
        break;
      case 4:
        MatrixCaseUtils::writeVectorConstructor<4>
                  ((ostream *)local_468,(Vector<float,_4> *)(s_constInVec4 + (long)local_474 * 0x10)
                  );
        break;
      case 5:
        tcu::Matrix<float,_2,_2>::Matrix
                  ((Matrix<float,_2,_2> *)&local_440,
                   (Matrix<float,_2,_2> *)(s_constInMat2 + (long)local_474 * 0x10));
        MatrixCaseUtils::writeMatrixConstructor<2,2>
                  ((ostream *)local_468,(Matrix<float,_2,_2> *)&local_440);
        break;
      case 9:
        tcu::Matrix<float,_3,_3>::Matrix
                  ((Matrix<float,_3,_3> *)&local_440,
                   (Matrix<float,_3,_3> *)(s_constInMat3 + (long)local_474 * 0x24));
        MatrixCaseUtils::writeMatrixConstructor<3,3>
                  ((ostream *)local_468,(Matrix<float,_3,_3> *)&local_440);
        break;
      case 0xd:
        tcu::Matrix<float,_4,_4>::Matrix
                  (&local_440,(Matrix<float,_4,_4> *)(s_constInMat4 + (long)local_474 * 0x40));
        MatrixCaseUtils::writeMatrixConstructor<4,4>((ostream *)local_468,&local_440);
      }
      std::operator<<((ostream *)local_468,";\n");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"in",&local_459);
      de::toString<int>(&local_380,&local_474);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440
                     ,&local_3e0,&local_380);
LAB_00e6e566:
      __return_storage_ptr__ = &local_380;
      std::__cxx11::string::operator=((string *)psVar14,(string *)&local_440);
      std::__cxx11::string::~string((string *)&local_440);
LAB_00e6e579:
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_3e0);
    }
    else {
      if (iVar5 == 1) {
        poVar8 = std::operator<<((ostream *)local_468,"uniform ");
        poVar8 = std::operator<<(poVar8,pcVar6);
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = std::operator<<(poVar8,pcVar7);
        poVar8 = std::operator<<(poVar8," u_in");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_474);
        std::operator<<(poVar8,";\n");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"u_in",&local_459);
        de::toString<int>(&local_380,&local_474);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_440,&local_3e0,&local_380);
        goto LAB_00e6e566;
      }
      if (iVar5 == 2) {
        poVar8 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "attribute ");
        poVar8 = std::operator<<(poVar8,pcVar6);
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = std::operator<<(poVar8,pcVar7);
        std::operator<<(poVar8," a_");
        iVar5 = *(int *)((long)&(local_470->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                _vptr_TestNode + lVar12 + 4);
        if (8 < iVar5 - 5U && 8 < iVar5 - 0x12U) {
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"coords;\n");
          if ((local_470->super_ShaderRenderCase).m_isVertexCase == false) {
            poVar8 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                     "varying ");
            poVar8 = std::operator<<(poVar8,pcVar6);
            poVar8 = std::operator<<(poVar8," ");
            poVar8 = std::operator<<(poVar8,pcVar7);
            std::operator<<(poVar8," v_coords;\n");
            poVar8 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                                     "varying ");
            poVar8 = std::operator<<(poVar8,pcVar6);
            poVar8 = std::operator<<(poVar8," ");
            poVar8 = std::operator<<(poVar8,pcVar7);
            std::operator<<(poVar8," v_coords;\n");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_440,"coords",(allocator<char> *)&local_3e0);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &passVars,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_440);
            std::__cxx11::string::~string((string *)&local_440);
          }
          std::__cxx11::string::assign((char *)psVar14);
          goto LAB_00e6e589;
        }
        poVar8 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar7);
        std::operator<<(poVar8,";\n");
        __s = "a_";
        if ((local_470->super_ShaderRenderCase).m_isVertexCase == false) {
          poVar8 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                   "varying ");
          poVar8 = std::operator<<(poVar8,pcVar6);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,pcVar7);
          poVar8 = std::operator<<(poVar8," v_");
          poVar8 = std::operator<<(poVar8,pcVar7);
          std::operator<<(poVar8,";\n");
          poVar8 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                                   "varying ");
          poVar8 = std::operator<<(poVar8,pcVar6);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,pcVar7);
          poVar8 = std::operator<<(poVar8," v_");
          poVar8 = std::operator<<(poVar8,pcVar7);
          std::operator<<(poVar8,";\n");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_440,pcVar7,(allocator<char> *)&local_3e0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&passVars,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440
                    );
          std::__cxx11::string::~string((string *)&local_440);
          __s = "v_";
          if (((local_470->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
            __s = "a_";
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e0,__s,(allocator<char> *)&local_380);
        pcVar6 = glu::getDataTypeName
                           (*(DataType *)
                             ((long)&(local_470->super_ShaderRenderCase).super_TestCase.
                                     super_TestNode._vptr_TestNode + lVar12 + 4));
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440;
        std::operator+(__return_storage_ptr__,&local_3e0,pcVar6);
        std::__cxx11::string::operator=((string *)psVar14,(string *)__return_storage_ptr__);
        goto LAB_00e6e579;
      }
    }
LAB_00e6e589:
  }
  poVar8 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  poVar8 = std::operator<<(poVar8,"void main (void)\n");
  poVar8 = std::operator<<(poVar8,"{\n");
  std::operator<<(poVar8,"\tgl_Position = a_position;\n");
  poVar8 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  poVar8 = std::operator<<(poVar8,"void main (void)\n");
  std::operator<<(poVar8,"{\n");
  if ((local_470->super_ShaderRenderCase).m_isVertexCase == true) {
    std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tgl_FragColor = v_color;\n");
  }
  else {
    for (pbVar18 = passVars.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar18 !=
        passVars.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar18 = pbVar18 + 1) {
      poVar8 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\tv_");
      poVar8 = std::operator<<(poVar8,(string *)pbVar18);
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = std::operator<<(poVar8,"a_");
      poVar8 = std::operator<<(poVar8,(string *)pbVar18);
      std::operator<<(poVar8,";\n");
    }
  }
  if (local_470->m_op - OP_PRE_INCREMENT < 4) {
    poVar8 = std::operator<<((ostream *)local_468,"\t");
    pcVar6 = glu::getPrecisionName(local_458);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," ");
    pcVar6 = glu::getDataTypeName((DataType)local_450);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," tmpValue = ");
    poVar8 = std::operator<<(poVar8,(string *)&inValue0);
    std::operator<<(poVar8,";\n");
    std::__cxx11::string::assign((char *)&operationValue0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&operationValue0);
  }
  psVar14 = &operationValue1;
  std::__cxx11::string::_M_assign((string *)psVar14);
  OVar3 = MatrixCaseUtils::getOperationType(local_470->m_op);
  switch(OVar3) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    poVar8 = std::operator<<((ostream *)local_468,"\t");
    pcVar6 = glu::getPrecisionName(local_458);
    poVar8 = std::operator<<(poVar8,pcVar6);
    pcVar6 = " ";
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = glu::getDataTypeName((DataType)local_450);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," res = ");
    poVar9 = (ostringstream *)std::operator<<(poVar8,(string *)&operationValue0);
    goto LAB_00e6e8b6;
  case OPERATIONTYPE_BINARY_FUNCTION:
    poVar8 = std::operator<<((ostream *)local_468,"\t");
    pcVar6 = glu::getPrecisionName(local_458);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," ");
    pcVar6 = glu::getDataTypeName((DataType)local_450);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," res = ");
    pcVar6 = MatrixCaseUtils::getOperationName(local_470->m_op);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = std::operator<<(poVar8,(string *)&operationValue0);
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = std::operator<<(poVar8,(string *)&operationValue1);
    local_400 = ");\n";
    break;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    poVar8 = std::operator<<((ostream *)local_468,"\t");
    pcVar6 = glu::getPrecisionName(local_458);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," ");
    pcVar6 = glu::getDataTypeName((DataType)local_450);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," res = ");
    pcVar6 = MatrixCaseUtils::getOperationName(local_470->m_op);
    poVar8 = std::operator<<(poVar8,pcVar6);
    psVar14 = &operationValue0;
    goto LAB_00e6e974;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    poVar8 = std::operator<<((ostream *)local_468,"\t");
    pcVar6 = glu::getPrecisionName(local_458);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," ");
    pcVar6 = glu::getDataTypeName((DataType)local_450);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," res = ");
    poVar8 = std::operator<<(poVar8,(string *)&operationValue0);
    pcVar6 = MatrixCaseUtils::getOperationName(local_470->m_op);
    poVar8 = std::operator<<(poVar8,pcVar6);
    break;
  case OPERATIONTYPE_ASSIGNMENT:
    poVar8 = std::operator<<((ostream *)local_468,"\t");
    pcVar6 = glu::getPrecisionName(local_458);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," ");
    pcVar6 = glu::getDataTypeName((DataType)local_450);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," res = ");
    poVar8 = std::operator<<(poVar8,(string *)&operationValue0);
    std::operator<<(poVar8,";\n");
    pcVar6 = "\tres ";
    poVar9 = local_468;
LAB_00e6e8b6:
    poVar8 = std::operator<<((ostream *)poVar9,pcVar6);
    pcVar6 = MatrixCaseUtils::getOperationName(local_470->m_op);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," ");
LAB_00e6e974:
    poVar8 = std::operator<<(poVar8,(string *)psVar14);
    break;
  default:
    goto switchD_00e6e7b2_default;
  }
  std::operator<<(poVar8,local_400);
switchD_00e6e7b2_default:
  poVar8 = std::operator<<((ostream *)local_468,"\t");
  pcVar6 = "gl_FragColor";
  if ((local_470->super_ShaderRenderCase).m_isVertexCase != false) {
    pcVar6 = "v_color";
  }
  poVar8 = std::operator<<(poVar8,pcVar6);
  std::operator<<(poVar8," = ");
  if (local_470->m_op - OP_PRE_INCREMENT < 4) {
    pSVar15 = (ShaderMatrixCase *)0x1813dcf;
    poVar8 = std::operator<<((ostream *)local_468,"vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_((string *)&local_440,pSVar15,&local_454,"res");
    poVar8 = std::operator<<(poVar8,(string *)&local_440);
    pcVar6 = ", 1.0) + vec4(";
    poVar8 = std::operator<<(poVar8,", 1.0) + vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_3e0,(ShaderMatrixCase *)pcVar6,&local_454,"tmpValue");
    poVar8 = std::operator<<(poVar8,(string *)&local_3e0);
    std::operator<<(poVar8,", 0.0);\n");
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  else {
    pSVar15 = (ShaderMatrixCase *)0x1813dcf;
    poVar8 = std::operator<<((ostream *)local_468,"vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_((string *)&local_440,pSVar15,&local_454,"res");
    poVar8 = std::operator<<(poVar8,(string *)&local_440);
    std::operator<<(poVar8,", 1.0);\n");
  }
  std::__cxx11::string::~string((string *)&local_440);
  std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  pSVar15 = local_470;
  std::__cxx11::string::operator=
            ((string *)&(local_470->super_ShaderRenderCase).m_vertShaderSource,(string *)&local_440)
  ;
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(pSVar15->super_ShaderRenderCase).m_fragShaderSource,(string *)&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  this_00 = &(pSVar15->super_ShaderRenderCase).m_userAttribTransforms;
  ctx_00 = (EVP_PKEY_CTX *)&DAT_00000004;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (this_00,4);
  lVar12 = 3;
  uVar17 = 1;
  lVar16 = 0;
  for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 0x40) {
    local_3e0._M_dataplus._M_p._0_4_ = 0;
    tcu::Matrix<float,_4,_4>::Matrix(&local_440,(float *)&local_3e0);
    tcu::Matrix<float,_4,_4>::operator=
              ((Matrix<float,_4,_4> *)
               ((long)(((this_00->
                        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
               lVar13),&local_440);
    pMVar2 = (this_00->
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)(pMVar2->m_data).m_data[0].m_data + lVar16) = 0x3f800000;
    *(undefined4 *)((long)((pMVar2->m_data).m_data + 1) + (ulong)(uVar17 & 3) * 4 + lVar13) =
         0x3f800000;
    ctx_00 = (EVP_PKEY_CTX *)(lVar12 - 3U ^ 2);
    *(undefined4 *)((long)((pMVar2->m_data).m_data + 2) + (long)ctx_00 * 4 + lVar13) = 0x3f800000;
    *(undefined4 *)((long)((pMVar2->m_data).m_data + 3) + (ulong)((uint)lVar12 & 3) * 4 + lVar13) =
         0x3f800000;
    lVar12 = lVar12 + 1;
    lVar16 = lVar16 + 0x44;
    uVar17 = (uVar17 & 3) + 1;
  }
  TVar4 = MatrixCaseUtils::getOperationTestMatrixType(local_470->m_op);
  if (TVar4 != TESTMATRIXTYPE_DEFAULT) {
    pEVar11 = (EVP_PKEY_CTX *)0x0;
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      ctx_00 = pEVar11;
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        pMVar2 = (this_00->
                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
          if (TVar4 == TESTMATRIXTYPE_DECREMENTED) {
            fVar21 = *(float *)(ctx_00 + (long)(pMVar2->m_data).m_data[0].m_data + lVar16) + -0.1;
LAB_00e6edc9:
            *(float *)(ctx_00 + (long)(pMVar2->m_data).m_data[0].m_data + lVar16) = fVar21;
          }
          else {
            if (TVar4 == TESTMATRIXTYPE_INCREMENTED) {
              fVar21 = *(float *)(ctx_00 + (long)(pMVar2->m_data).m_data[0].m_data + lVar16) + 0.3;
              goto LAB_00e6edc9;
            }
            if (TVar4 == TESTMATRIXTYPE_NEGATED) {
              fVar21 = -*(float *)(ctx_00 + (long)(pMVar2->m_data).m_data[0].m_data + lVar16);
              goto LAB_00e6edc9;
            }
          }
        }
        ctx_00 = ctx_00 + 4;
      }
      pEVar11 = pEVar11 + 0x40;
    }
  }
  deqp::gls::ShaderRenderCase::init(&local_470->super_ShaderRenderCase,ctx_00);
  std::__cxx11::string::~string((string *)&operationValue1);
  std::__cxx11::string::~string((string *)&operationValue0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&passVars);
  std::__cxx11::string::~string((string *)&inValue1);
  std::__cxx11::string::~string((string *)&inValue0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  iVar5 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  return iVar5;
}

Assistant:

void ShaderMatrixCase::init (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = otherType;
		}
	}

	vtx << "attribute highp vec4 a_position;\n";
	if (m_isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}

	// Input declarations.
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			vtx << "attribute " << precName << " " << typeName << " a_";

			if (isDataTypeMatrix(in.dataType))
			{
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "varying " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "varying " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "varying " << precName << " " << typeName << " v_coords;\n";
					frag << "varying " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "uniform " << precName << " " << typeName << " u_in" << inNdx << ";\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2[inNdx]));		break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3[inNdx]));		break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
	{
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified.
	op << "	" << (m_isVertexCase ? "v_color" : "gl_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();

	// \todo [2012-02-14 pyry] Compute better values for matrix tests.
	m_userAttribTransforms.resize(4);
	for (int attribNdx = 0; attribNdx < 4; attribNdx++)
	{
		m_userAttribTransforms[attribNdx] = Mat4(0.0f);
		m_userAttribTransforms[attribNdx]((0 + attribNdx) % 4, 0) = 1.0f;
		m_userAttribTransforms[attribNdx]((1 + attribNdx) % 4, 1) = 1.0f;
		m_userAttribTransforms[attribNdx]((2 + attribNdx) % 4, 2) = 1.0f;
		m_userAttribTransforms[attribNdx]((3 + attribNdx) % 4, 3) = 1.0f;
	}

	// prevent bad reference cases such as black result images by fine-tuning used matrices
	if (getOperationTestMatrixType(m_op) != TESTMATRIXTYPE_DEFAULT)
	{
		for (int attribNdx = 0; attribNdx < 4; attribNdx++)
		{
			for (int row = 0; row < 4; row++)
			for (int col = 0; col < 4; col++)
			{
				switch (getOperationTestMatrixType(m_op))
				{
					case TESTMATRIXTYPE_NEGATED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col);
						break;
					case TESTMATRIXTYPE_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) += 0.3f;
						break;
					case TESTMATRIXTYPE_DECREMENTED:
						m_userAttribTransforms[attribNdx](row, col) -= 0.1f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
						break;
				}
			}
		}
	}

	ShaderRenderCase::init();
}